

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.cpp
# Opt level: O2

raw_ostream * __thiscall llvm::raw_ostream::indent(raw_ostream *this,uint NumSpaces)

{
  size_t in_RCX;
  uint uVar1;
  void *__buf;
  void *__buf_00;
  
  __buf = (void *)(ulong)NumSpaces;
  if (NumSpaces < 0x50) {
    write(this,0x18d3c0,__buf,in_RCX);
  }
  else {
    while (uVar1 = (uint)__buf, uVar1 != 0) {
      __buf_00 = (void *)0x4f;
      if (uVar1 < 0x4f) {
        __buf_00 = __buf;
      }
      write(this,0x18d3c0,__buf_00,in_RCX);
      __buf = (void *)(ulong)(uVar1 - (int)__buf_00);
    }
  }
  return this;
}

Assistant:

raw_ostream &raw_ostream::indent(unsigned NumSpaces) {
  return write_padding<' '>(*this, NumSpaces);
}